

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode_00;
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint8_t uVar5;
  char cVar6;
  int iVar7;
  undefined8 in_RAX;
  shared_container_t *sc;
  run_container_t *prVar8;
  undefined8 *c;
  container_t *c_00;
  long lVar9;
  uint uVar10;
  uint unaff_EBP;
  uint uVar11;
  int iVar12;
  long lVar13;
  run_container_t *run;
  int32_t iVar14;
  ushort key;
  uint8_t newtypecode;
  uint8_t typecode;
  undefined8 uStack_38;
  
  iVar7 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  if (((long)iVar7 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar7 + -1] == key)
     ) {
    uVar11 = iVar7 - 1;
  }
  else {
    iVar12 = iVar7 + -1;
    uVar10 = 0;
    do {
      if (iVar12 < (int)uVar10) {
        uVar11 = ~uVar10;
        break;
      }
      uVar11 = uVar10 + iVar12 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar10 + iVar12 & 0xfffffffe));
      if (uVar1 < key) {
        uVar10 = uVar11 + 1;
        bVar4 = true;
        uVar11 = unaff_EBP;
      }
      else if (key < uVar1) {
        iVar12 = uVar11 - 1;
        bVar4 = true;
        uVar11 = unaff_EBP;
      }
      else {
        bVar4 = false;
      }
      unaff_EBP = uVar11;
    } while (bVar4);
  }
  uStack_38 = in_RAX;
  if ((int)uVar11 < 0) {
    c = (undefined8 *)malloc(0x10);
    if (c == (undefined8 *)0x0) {
      c = (undefined8 *)0x0;
    }
    else {
      *c = 0;
      c[1] = 0;
    }
    c_00 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
    ra_insert_new_key_value_at(&r->high_low_container,~uVar11,key,c_00,uStack_38._7_1_);
  }
  else {
    if (iVar7 <= (int)(uVar11 & 0xffff)) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    uVar10 = uVar11 & 0xffff;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar10];
    if (puVar3[uVar10] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar10);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8)) = sc;
    typecode_00 = (r->high_low_container).typecodes[uVar10];
    uStack_38 = CONCAT17(typecode_00,(undefined7)uStack_38);
    run = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8));
    prVar8 = run;
    uVar5 = typecode_00;
    if (typecode_00 == '\x04') {
      uVar5 = *(uint8_t *)&run->runs;
      if (uVar5 == '\x04') goto LAB_00113f6a;
      prVar8 = *(run_container_t **)run;
    }
    if (uVar5 == '\x03') {
      lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
        iVar14 = prVar8->n_runs;
        lVar9 = (long)iVar14;
        if (0 < lVar9) {
          lVar13 = 0;
          do {
            iVar14 = iVar14 + (uint)prVar8->runs[lVar13].length;
            lVar13 = lVar13 + 1;
          } while (lVar9 != lVar13);
        }
      }
      else {
        iVar14 = _avx2_run_container_cardinality(prVar8);
      }
    }
    else {
      if ((uVar5 != '\x02') && (uVar5 != '\x01')) goto LAB_00113fa8;
      iVar14 = prVar8->n_runs;
    }
    uStack_38._0_7_ = CONCAT16(typecode_00,(undefined6)uStack_38);
    prVar8 = (run_container_t *)
             container_add(run,(uint16_t)val,typecode_00,(uint8_t *)((long)&uStack_38 + 6));
    if (prVar8 == run) {
      cVar6 = uStack_38._6_1_;
      if (uStack_38._6_1_ == '\x04') {
        cVar6 = *(char *)&run->runs;
        if (cVar6 == '\x04') {
LAB_00113f6a:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        run = *(run_container_t **)run;
      }
      if (cVar6 == '\x03') {
        lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
          iVar7 = run->n_runs;
          lVar9 = (long)iVar7;
          if (0 < lVar9) {
            lVar13 = 0;
            do {
              iVar7 = iVar7 + (uint)run->runs[lVar13].length;
              lVar13 = lVar13 + 1;
            } while (lVar9 != lVar13);
          }
        }
        else {
          iVar7 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        if ((cVar6 != '\x02') && (cVar6 != '\x01')) {
LAB_00113fa8:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        iVar7 = run->n_runs;
      }
      return iVar14 != iVar7;
    }
    container_free(run,typecode_00);
    if ((r->high_low_container).size <= (int)uVar11) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a3a,
                    "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                   );
    }
    (r->high_low_container).containers[uVar11] = prVar8;
    (r->high_low_container).typecodes[uVar11] = uStack_38._6_1_;
  }
  return true;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}